

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_move.cpp
# Opt level: O1

void __thiscall DBot::TurnToAng(DBot *this)

{
  player_t *ppVar1;
  AWeapon *pAVar2;
  APlayerPawn *pAVar3;
  bool bVar4;
  AActor *pAVar5;
  double dVar6;
  double dVar7;
  DAngle local_10;
  
  ppVar1 = this->player;
  pAVar2 = ppVar1->ReadyWeapon;
  dVar7 = 15.0;
  if (pAVar2 != (AWeapon *)0x0) {
    if ((((pAVar2->super_AInventory).field_0x4df & 0x40) != 0) && (this->t_roam != 0)) {
      pAVar5 = (this->missile).field_0.p;
      if (pAVar5 == (AActor *)0x0) {
        return;
      }
      if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (this->missile).field_0.p = (AActor *)0x0;
        return;
      }
    }
    pAVar5 = (this->enemy).field_0.p;
    if (pAVar5 != (AActor *)0x0) {
      if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar5 = (this->dest).field_0.p;
        if (pAVar5 != (AActor *)0x0) {
          if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00470d3a;
          (this->dest).field_0.p = (AActor *)0x0;
        }
        pAVar2 = ppVar1->ReadyWeapon;
        if ((pAVar2->ProjectileType == (PClassActor *)0x0) &&
           (((pAVar2->super_AInventory).field_0x4dd & 0x80) == 0)) {
          pAVar5 = (this->enemy).field_0.p;
          if ((pAVar5 != (AActor *)0x0) &&
             (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->enemy).field_0.p = (AActor *)0x0;
            pAVar5 = (AActor *)0x0;
          }
          local_10.Degrees = 65.0;
          bVar4 = Check_LOS(this,pAVar5,&local_10);
          dVar7 = 15.0;
          if (bVar4) {
            dVar7 = 3.0;
          }
        }
      }
      else {
        (this->enemy).field_0.p = (AActor *)0x0;
      }
    }
  }
LAB_00470d3a:
  dVar6 = (double)SUB84(((this->Angle).Degrees - (this->player->mo->super_AActor).Angles.Yaw.Degrees
                        ) * 11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08;
  if (ABS(dVar6) < 5.0) {
    pAVar5 = (this->enemy).field_0.p;
    if (pAVar5 == (AActor *)0x0) {
      return;
    }
    if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->enemy).field_0.p = (AActor *)0x0;
      return;
    }
  }
  dVar6 = dVar6 / 3.0;
  if (dVar7 < ABS(dVar6)) {
    dVar6 = (double)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar7 | (ulong)-dVar7 & -(ulong)(dVar6 < 0.0));
  }
  pAVar3 = this->player->mo;
  (pAVar3->super_AActor).Angles.Yaw.Degrees = dVar6 + (pAVar3->super_AActor).Angles.Yaw.Degrees;
  return;
}

Assistant:

void DBot::TurnToAng ()
{
    double maxturn = MAXTURN;

	if (player->ReadyWeapon != NULL)
	{
		if (player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE)
		{
			if (t_roam && !missile)
			{ //Keep angle that where when shot where decided.
				return;
			}
		}


		if(enemy)
			if(!dest) //happens when running after item in combat situations, or normal, prevents weak turns
				if(player->ReadyWeapon->ProjectileType == NULL && !(player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON))
					if(Check_LOS(enemy, SHOOTFOV+5))
						maxturn = 3;
	}

	DAngle distance = deltaangle(player->mo->Angles.Yaw, Angle);

	if (fabs (distance) < OKAYRANGE && !enemy)
		return;

	distance /= TURNSENS;
	if (fabs (distance) > maxturn)
		distance = distance < 0 ? -maxturn : maxturn;

	player->mo->Angles.Yaw += distance;
}